

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lts.c
# Opt level: O0

int lts_apply(char *in_word,char *feats,cst_lts_rules *r,lex_entry_t *out_phones)

{
  uint uVar1;
  int iVar2;
  cst_lts_phone cVar3;
  char *__s;
  size_t sVar4;
  char **ppcVar5;
  acmod_id_t *paVar6;
  cst_lts_letter *vals;
  char *__s_00;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar11;
  char *word;
  char zeros [8];
  char hash;
  char *p;
  char *right;
  char *left;
  cst_lts_phone phone;
  cst_lts_letter *full_buff;
  cst_lts_letter *fval_buff;
  int maxphones;
  int i;
  int index;
  int pos;
  lex_entry_t *out_phones_local;
  cst_lts_rules *r_local;
  char *feats_local;
  char *in_word_local;
  
  __s = __ckd_salloc__(in_word,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                       ,0x6e);
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (r->letter_table == (char **)0x0) {
    fval_buff._4_4_ = 0;
    while( true ) {
      sVar4 = strlen(__s);
      uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (sVar4 <= (ulong)(long)fval_buff._4_4_) break;
      iVar2 = tolower((int)__s[fval_buff._4_4_]);
      __s[fval_buff._4_4_] = (char)iVar2;
      fval_buff._4_4_ = fval_buff._4_4_ + 1;
    }
  }
  sVar4 = strlen(__s);
  fval_buff._0_4_ = (int)sVar4 + 10;
  ppcVar5 = (char **)__ckd_malloc__((long)(int)(uint)fval_buff << 3,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                    ,0x75);
  out_phones->phone = ppcVar5;
  paVar6 = (acmod_id_t *)
           __ckd_malloc__((long)(int)(uint)fval_buff << 2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                          ,0x76);
  out_phones->ci_acmod_id = paVar6;
  out_phones->phone_cnt = 0;
  vals = (cst_lts_letter *)
         __ckd_calloc__((long)(r->context_window_size * 2 + r->context_extra_feats),1,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                        ,0x7b);
  iVar2 = r->context_window_size;
  sVar4 = strlen(__s);
  __s_00 = (char *)__ckd_calloc__((long)(iVar2 << 1) + sVar4 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                  ,0x7e);
  if (r->letter_table == (char **)0x0) {
    sprintf(__s_00,"%.*s#%s#%.*s",(ulong)(r->context_window_size - 1),"00000000",__s,
            (ulong)(r->context_window_size - 1),"00000000");
    zeros[0] = '#';
  }
  else {
    for (fval_buff._4_4_ = 0; fval_buff._4_4_ < 8; fval_buff._4_4_ = fval_buff._4_4_ + 1) {
      *(undefined1 *)((long)&word + (long)fval_buff._4_4_ + 7) = 2;
    }
    sprintf(__s_00,"%.*s%c%s%c%.*s",(ulong)(r->context_window_size - 1),(long)&word + 7,1,__s,
            CONCAT44(uVar11,1),r->context_window_size + -1,(long)&word + 7);
    zeros[0] = '\x01';
  }
  i = r->context_window_size;
  while ((uint)(byte)__s_00[i] != (int)zeros[0]) {
    sprintf((char *)vals,"%.*s%.*s%s",(ulong)(uint)r->context_window_size,
            __s_00 + ((long)i - (long)r->context_window_size),(ulong)(uint)r->context_window_size,
            __s_00 + (long)i + 1,feats);
    if ((r->letter_table != (char **)0x0) || ((0x60 < (byte)__s_00[i] && ((byte)__s_00[i] < 0x7b))))
    {
      if (r->letter_table == (char **)0x0) {
        maxphones = (int)((byte)__s_00[i] - 0x61) % 0x1a;
      }
      else {
        maxphones = (byte)__s_00[i] - 3;
      }
      cVar3 = apply_model(vals,r->letter_index[maxphones],r->models);
      iVar2 = strcmp("epsilon",r->phone_table[cVar3]);
      if (iVar2 != 0) {
        if ((uint)fval_buff < out_phones->phone_cnt + 2) {
          fval_buff._0_4_ = (uint)fval_buff + 10;
          ppcVar5 = (char **)__ckd_realloc__(out_phones->phone,(long)(int)(uint)fval_buff << 3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                             ,0xa9);
          out_phones->phone = ppcVar5;
          paVar6 = (acmod_id_t *)
                   __ckd_realloc__(out_phones->ci_acmod_id,(long)(int)(uint)fval_buff << 2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                   ,0xac);
          out_phones->ci_acmod_id = paVar6;
        }
        register0x00000000 = strchr(r->phone_table[cVar3],0x2d);
        if (register0x00000000 == (char *)0x0) {
          pcVar10 = __ckd_salloc__(r->phone_table[cVar3],
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                   ,0xb9);
          uVar1 = out_phones->phone_cnt;
          out_phones->phone_cnt = uVar1 + 1;
          out_phones->phone[uVar1] = pcVar10;
        }
        else {
          pcVar10 = r->phone_table[cVar3];
          sVar4 = strlen(r->phone_table[cVar3]);
          sVar7 = strlen(stack0xffffffffffffff98);
          pcVar8 = cst_substr(pcVar10,0,(int)sVar4 - (int)sVar7);
          pcVar10 = r->phone_table[cVar3];
          sVar4 = strlen(r->phone_table[cVar3]);
          sVar7 = strlen(stack0xffffffffffffff98);
          sVar9 = strlen(stack0xffffffffffffff98);
          pcVar10 = cst_substr(pcVar10,((int)sVar4 - (int)sVar7) + 1,(int)sVar9 + -1);
          uVar1 = out_phones->phone_cnt;
          out_phones->phone_cnt = uVar1 + 1;
          out_phones->phone[uVar1] = pcVar8;
          uVar1 = out_phones->phone_cnt;
          out_phones->phone_cnt = uVar1 + 1;
          out_phones->phone[uVar1] = pcVar10;
        }
      }
    }
    i = i + 1;
  }
  ckd_free(__s_00);
  ckd_free(vals);
  ckd_free(__s);
  return 0;
}

Assistant:

int
lts_apply(const char *in_word, const char *feats,
          const cst_lts_rules * r, lex_entry_t * out_phones)
{
    int pos, index, i, maxphones;
    cst_lts_letter *fval_buff;
    cst_lts_letter *full_buff;
    cst_lts_phone phone;
    char *left, *right, *p;
    char hash;
    char zeros[8];
    char *word;

    /* Downcase the incoming word unless we are a non-roman alphabet. */
    word = ckd_salloc((char *) in_word);
    if (!r->letter_table)
        for (i = 0; i < strlen(word); ++i)
            word[i] = tolower(word[i]);

    /* Fill in out_phones structure as best we can. */
    maxphones = strlen(word) + 10;
    out_phones->phone = ckd_malloc(maxphones * sizeof(char *));
    out_phones->ci_acmod_id = ckd_malloc(maxphones * sizeof(acmod_id_t));
    out_phones->phone_cnt = 0;

    /* For feature vals for each letter */
    fval_buff = ckd_calloc((r->context_window_size * 2) +
                           r->context_extra_feats, sizeof(cst_lts_letter));
    /* Buffer with added contexts */
    full_buff = ckd_calloc((r->context_window_size * 2) +       /* TBD assumes single POS feat */
                           strlen(word) + 1, sizeof(cst_lts_letter));
    if (r->letter_table) {
        for (i = 0; i < 8; i++)
            zeros[i] = 2;
        sprintf((char *)full_buff, "%.*s%c%s%c%.*s",
                r->context_window_size - 1, zeros,
                1, word, 1, r->context_window_size - 1, zeros);
        hash = 1;
    }
    else {
        /* Assumes l_letter is a char and context < 8 */
        sprintf((char *)full_buff, "%.*s#%s#%.*s",
                r->context_window_size - 1, "00000000",
                word, r->context_window_size - 1, "00000000");
        hash = '#';
    }

    /* Do the prediction forwards (begone, foul LISP!) */
    for (pos = r->context_window_size; full_buff[pos] != hash; ++pos) {
        /* Fill the features buffer for the predictor */
        sprintf((char *)fval_buff, "%.*s%.*s%s",
                r->context_window_size,
                full_buff + pos - r->context_window_size,
                r->context_window_size, full_buff + pos + 1, feats);
        if ((!r->letter_table
             && ((full_buff[pos] < 'a') || (full_buff[pos] > 'z')))) {
#ifdef EXCESSIVELY_CHATTY
            E_WARN("lts:skipping unknown char \"%c\"\n", full_buff[pos]);
#endif
            continue;
        }
        if (r->letter_table)
            index = full_buff[pos] - 3;
        else
            index = (full_buff[pos] - 'a') % 26;
        phone = apply_model(fval_buff, r->letter_index[index], r->models);
        /* delete epsilons and split dual-phones */
        if (0 == strcmp("epsilon", r->phone_table[phone]))
            continue;
        /* dynamically grow out_phones if necessary. */
        if (out_phones->phone_cnt + 2 > maxphones) {
            maxphones += 10;
            out_phones->phone = ckd_realloc(out_phones->phone,
                                            maxphones * sizeof(char *));
            out_phones->ci_acmod_id = ckd_realloc(out_phones->ci_acmod_id,
                                                  maxphones *
                                                  sizeof(acmod_id_t));
        }
        if ((p = strchr(r->phone_table[phone], '-')) != NULL) {
            left = cst_substr(r->phone_table[phone], 0,
                              strlen(r->phone_table[phone]) - strlen(p));
            right = cst_substr(r->phone_table[phone],
                               (strlen(r->phone_table[phone]) -
                                strlen(p)) + 1, (strlen(p) - 1));
            out_phones->phone[out_phones->phone_cnt++] = left;
            out_phones->phone[out_phones->phone_cnt++] = right;
        }
        else
            out_phones->phone[out_phones->phone_cnt++] =
                ckd_salloc((char *) r->phone_table[phone]);
    }


    ckd_free(full_buff);
    ckd_free(fval_buff);
    ckd_free(word);
    return S3_SUCCESS;
}